

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)

{
  LocalRootParameterType LVar1;
  CFGNode *entry;
  undefined8 uVar2;
  bool bVar3;
  uint32_t uVar4;
  char *entry_00;
  reference this;
  type cap;
  reference pLVar5;
  void *pvVar6;
  type pCVar7;
  Function **this_00;
  reference pFVar8;
  LoggingCallback p_Var9;
  String *__str;
  String local_3390;
  ShaderFeature local_336c;
  char local_3368 [4];
  int i;
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  CFGStructurizer structurizer_1;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  Function *leaf;
  iterator __end1_2;
  iterator __begin1_2;
  Vector<Function> *__range1_2;
  uint32_t driver_version;
  uint32_t driver_id;
  CFGStructurizer structurizer;
  char local_10b8 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ConvertedFunction entry_point;
  LocalRootParameter *local_param;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<LocalRootParameter> *__range1_1;
  unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_> *opt;
  iterator __end1;
  iterator __begin1;
  Vector<std::unique_ptr<OptionBase>_> *__range1;
  Converter dxil_converter;
  SPIRVModule module;
  dxil_spv_converter converter_local;
  
  dxil_spv::SPIRVModule::SPIRVModule((SPIRVModule *)&dxil_converter);
  dxil_spv::Converter::Converter
            ((Converter *)&__range1,converter->bc_parser,converter->bc_reflection_parser,
             (SPIRVModule *)&dxil_converter);
  bVar3 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::empty
                    (&converter->entry_point);
  if (!bVar3) {
    entry_00 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str(&converter->entry_point);
    dxil_spv::Converter::set_entry_point((Converter *)&__range1,entry_00);
  }
  dxil_spv::Converter::set_resource_remapping_interface
            ((Converter *)&__range1,&(converter->remapper).super_ResourceRemappingInterface);
  __end1 = std::
           vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
           ::begin(&converter->options);
  opt = (unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_> *)
        std::
        vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
        ::end(&converter->options);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_*,_std::vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>_>
                                     *)&opt), bVar3) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_*,_std::vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>_>
           ::operator*(&__end1);
    cap = std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>::
          operator*(this);
    dxil_spv::Converter::add_option((Converter *)&__range1,cap);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_*,_std::vector<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::
             begin(&converter->local_root_parameters);
  local_param = (LocalRootParameter *)
                std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
                ::end(&converter->local_root_parameters);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<LocalRootParameter_*,_std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>_>
                             *)&local_param), bVar3) {
    pLVar5 = __gnu_cxx::
             __normal_iterator<LocalRootParameter_*,_std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>_>
             ::operator*(&__end1_1);
    LVar1 = pLVar5->type;
    if (LVar1 == Constants) {
      dxil_spv::Converter::add_local_root_constants
                ((Converter *)&__range1,(pLVar5->local_constants).register_space,
                 (pLVar5->local_constants).register_index,(pLVar5->local_constants).num_words);
    }
    else if (LVar1 == Descriptor) {
      dxil_spv::Converter::add_local_root_descriptor
                ((Converter *)&__range1,(pLVar5->local_descriptor).resource_class,
                 (pLVar5->local_descriptor).register_space,(pLVar5->local_descriptor).register_index
                );
    }
    else if (LVar1 == Table) {
      std::
      vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
      ::vector((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                *)&entry_point.node_pool,&pLVar5->table_entries);
      dxil_spv::Converter::add_local_root_descriptor_table
                ((Converter *)&__range1,(Vector<DescriptorTableEntry> *)&entry_point.node_pool);
      std::
      vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
      ::~vector((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                 *)&entry_point.node_pool);
    }
    __gnu_cxx::
    __normal_iterator<LocalRootParameter_*,_std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>_>
    ::operator++(&__end1_1);
  }
  dxil_spv::Converter::convert_entry_point((ConvertedFunction *)&cb,(Converter *)&__range1);
  if (cb == (_func_void_void_ptr_LogLevel_char_ptr *)0x0) {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Failed to convert function.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_10b8,0x1000,"Failed to convert function.\n");
      uVar2 = buffer._4088_8_;
      pvVar6 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar2)(pvVar6,2,local_10b8);
    }
    converter_local._4_4_ = DXIL_SPV_ERROR_GENERIC;
  }
  else {
    pCVar7 = std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::
             operator*((unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                        *)&entry_point.leaf_functions.
                           super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    dxil_spv::CFGStructurizer::CFGStructurizer
              ((CFGStructurizer *)&driver_version,(CFGNode *)cb,pCVar7,
               (SPIRVModule *)&dxil_converter);
    bVar3 = dxil_spv::Converter::get_driver_version
                      ((Converter *)&__range1,(uint32_t *)((long)&__range1_2 + 4),
                       (uint32_t *)&__range1_2);
    if (bVar3) {
      dxil_spv::CFGStructurizer::set_driver_version
                ((CFGStructurizer *)&driver_version,__range1_2._4_4_,(uint32_t)__range1_2);
    }
    dxil_spv::SPIRVModule::set_entry_build_point
              ((SPIRVModule *)&dxil_converter,(Function *)entry_point.entry.entry);
    dxil_spv::CFGStructurizer::run((CFGStructurizer *)&driver_version);
    dxil_spv::SPIRVModule::emit_entry_point_function_body
              ((SPIRVModule *)&dxil_converter,(CFGStructurizer *)&driver_version);
    dxil_spv::CFGStructurizer::~CFGStructurizer((CFGStructurizer *)&driver_version);
    this_00 = &entry_point.entry.func;
    __end1_2 = std::
               vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
               ::begin((vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                        *)this_00);
    leaf = (Function *)
           std::
           vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
           ::end((vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                  *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<dxil_spv::ConvertedFunction::Function_*,_std::vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>_>
                               *)&leaf), bVar3) {
      pFVar8 = __gnu_cxx::
               __normal_iterator<dxil_spv::ConvertedFunction::Function_*,_std::vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>_>
               ::operator*(&__end1_2);
      if (pFVar8->entry == (CFGNode *)0x0) {
        p_Var9 = dxil_spv::get_thread_log_callback();
        if (p_Var9 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Leaf function is nullptr!\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&structurizer_1.driver_id,0x1000,"Leaf function is nullptr!\n");
          pvVar6 = dxil_spv::get_thread_log_callback_userdata();
          (*p_Var9)(pvVar6,Error,(char *)&structurizer_1.driver_id);
        }
        converter_local._4_4_ = DXIL_SPV_ERROR_GENERIC;
        goto LAB_00112fa8;
      }
      entry = pFVar8->entry;
      pCVar7 = std::unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>::
               operator*((unique_ptr<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                          *)&entry_point.leaf_functions.
                             super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dxil_spv::CFGStructurizer::CFGStructurizer
                ((CFGStructurizer *)&cb_2,entry,pCVar7,(SPIRVModule *)&dxil_converter);
      dxil_spv::SPIRVModule::set_entry_build_point((SPIRVModule *)&dxil_converter,pFVar8->func);
      dxil_spv::CFGStructurizer::run((CFGStructurizer *)&cb_2);
      dxil_spv::SPIRVModule::emit_leaf_function_body
                ((SPIRVModule *)&dxil_converter,pFVar8->func,(CFGStructurizer *)&cb_2);
      dxil_spv::CFGStructurizer::~CFGStructurizer((CFGStructurizer *)&cb_2);
      __gnu_cxx::
      __normal_iterator<dxil_spv::ConvertedFunction::Function_*,_std::vector<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>_>
      ::operator++(&__end1_2);
    }
    bVar3 = dxil_spv::SPIRVModule::finalize_spirv((SPIRVModule *)&dxil_converter,&converter->spirv);
    if (bVar3) {
      __str = dxil_spv::Converter::get_compiled_entry_point_abi_cxx11_((Converter *)&__range1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&converter->compiled_entry_point,__str);
      bVar3 = dxil_spv::SPIRVModule::has_builtin_shader_input
                        ((SPIRVModule *)&dxil_converter,BuiltInSubgroupSize);
      converter->uses_subgroup_size = bVar3;
      dxil_spv::Converter::get_workgroup_dimensions
                ((Converter *)&__range1,converter->workgroup_size,converter->workgroup_size + 1,
                 converter->workgroup_size + 2);
      dxil_spv::Converter::get_compute_wave_size_range
                ((Converter *)&__range1,&converter->wave_size_min,&converter->wave_size_max,
                 &converter->wave_size_preferred);
      uVar4 = dxil_spv::Converter::get_compute_heuristic_max_wave_size((Converter *)&__range1);
      converter->heuristic_wave_size = uVar4;
      uVar4 = dxil_spv::Converter::get_patch_vertex_count((Converter *)&__range1);
      converter->patch_vertex_count = uVar4;
      for (local_336c = Native16BitOperations; (int)local_336c < 1; local_336c = local_336c + Count)
      {
        bVar3 = dxil_spv::Converter::shader_requires_feature((Converter *)&__range1,local_336c);
        converter->shader_feature_used[(int)local_336c] = bVar3;
      }
      dxil_spv::Converter::get_analysis_warnings_abi_cxx11_(&local_3390,(Converter *)&__range1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&converter->analysis_warnings,&local_3390);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_3390);
      converter_local._4_4_ = DXIL_SPV_SUCCESS;
    }
    else {
      buffer_2._4088_8_ = dxil_spv::get_thread_log_callback();
      if ((LoggingCallback)buffer_2._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Failed to finalize SPIR-V.\n");
        fflush(_stderr);
      }
      else {
        snprintf(local_3368,0x1000,"Failed to finalize SPIR-V.\n");
        uVar2 = buffer_2._4088_8_;
        pvVar6 = dxil_spv::get_thread_log_callback_userdata();
        (*(code *)uVar2)(pvVar6,2,local_3368);
      }
      converter_local._4_4_ = DXIL_SPV_ERROR_GENERIC;
    }
  }
LAB_00112fa8:
  structurizer.driver_version = 1;
  dxil_spv::ConvertedFunction::~ConvertedFunction((ConvertedFunction *)&cb);
  dxil_spv::Converter::~Converter((Converter *)&__range1);
  dxil_spv::SPIRVModule::~SPIRVModule((SPIRVModule *)&dxil_converter);
  return converter_local._4_4_;
}

Assistant:

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)
{
	SPIRVModule module;
	Converter dxil_converter(converter->bc_parser, converter->bc_reflection_parser, module);

	if (!converter->entry_point.empty())
		dxil_converter.set_entry_point(converter->entry_point.c_str());
	dxil_converter.set_resource_remapping_interface(&converter->remapper);
	for (auto &opt : converter->options)
		dxil_converter.add_option(*opt);

	for (auto &local_param : converter->local_root_parameters)
	{
		switch (local_param.type)
		{
		case LocalRootParameterType::Constants:
			dxil_converter.add_local_root_constants(local_param.local_constants.register_space,
			                                        local_param.local_constants.register_index,
			                                        local_param.local_constants.num_words);
			break;

		case LocalRootParameterType::Descriptor:
			dxil_converter.add_local_root_descriptor(local_param.local_descriptor.resource_class,
			                                         local_param.local_descriptor.register_space,
			                                         local_param.local_descriptor.register_index);
			break;

		case LocalRootParameterType::Table:
			dxil_converter.add_local_root_descriptor_table(local_param.table_entries);
			break;
		}
	}

	auto entry_point = dxil_converter.convert_entry_point();

	if (entry_point.entry.entry == nullptr)
	{
		LOGE("Failed to convert function.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	{
		dxil_spv::CFGStructurizer structurizer(entry_point.entry.entry, *entry_point.node_pool, module);
		uint32_t driver_id, driver_version;
		if (dxil_converter.get_driver_version(driver_id, driver_version))
			structurizer.set_driver_version(driver_id, driver_version);
		module.set_entry_build_point(entry_point.entry.func);
		structurizer.run();
		module.emit_entry_point_function_body(structurizer);
	}

	for (auto &leaf : entry_point.leaf_functions)
	{
		if (!leaf.entry)
		{
			LOGE("Leaf function is nullptr!\n");
			return DXIL_SPV_ERROR_GENERIC;
		}
		dxil_spv::CFGStructurizer structurizer(leaf.entry, *entry_point.node_pool, module);
		module.set_entry_build_point(leaf.func);
		structurizer.run();
		module.emit_leaf_function_body(leaf.func, structurizer);
	}

	if (!module.finalize_spirv(converter->spirv))
	{
		LOGE("Failed to finalize SPIR-V.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	converter->compiled_entry_point = dxil_converter.get_compiled_entry_point();
	converter->uses_subgroup_size = module.has_builtin_shader_input(spv::BuiltInSubgroupSize);
	dxil_converter.get_workgroup_dimensions(converter->workgroup_size[0],
	                                        converter->workgroup_size[1],
	                                        converter->workgroup_size[2]);
	dxil_converter.get_compute_wave_size_range(converter->wave_size_min, converter->wave_size_max, converter->wave_size_preferred);
	converter->heuristic_wave_size = dxil_converter.get_compute_heuristic_max_wave_size();
	converter->patch_vertex_count = dxil_converter.get_patch_vertex_count();
	for (int i = 0; i < int(ShaderFeature::Count); i++)
		converter->shader_feature_used[i] = dxil_converter.shader_requires_feature(ShaderFeature(i));
	converter->analysis_warnings = dxil_converter.get_analysis_warnings();

	return DXIL_SPV_SUCCESS;
}